

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bits.h
# Opt level: O0

Index wasm::Bits::getMaxBits<wasm::OptimizeInstructions>
                (Expression *curr,OptimizeInstructions *localInfoProvider)

{
  bool bVar1;
  BasicType BVar2;
  int32_t iVar3;
  Index IVar4;
  Index IVar5;
  int64_t iVar6;
  int *piVar7;
  Index *pIVar8;
  uint *puVar9;
  LocalSet *pLVar10;
  LocalGet *get_00;
  Load *load_00;
  Index local_2b4;
  Index local_2b0;
  Index local_2ac;
  Index local_2a8;
  Index local_2a4;
  Load *load;
  LocalGet *get;
  LocalSet *set;
  Index maxBits_9;
  Index maxBits_8;
  Index maxBits_7;
  Index maxBits_6;
  Index maxBits_5;
  Unary *local_230;
  Unary *unary;
  uint local_220;
  Index local_21c;
  uint local_218;
  Index local_214;
  uint shifts_5;
  Index maxBits_4;
  Const *shift_3;
  uint local_200;
  Index local_1fc;
  uint local_1f8;
  Index local_1f4;
  uint shifts_4;
  Index maxBits_3;
  Const *shift_2;
  uint local_1e0;
  Index local_1dc;
  Const *pCStack_1d8;
  Index maxBits_2;
  Const *shifts_3;
  Index local_1c8;
  Index local_1c4;
  uint local_1c0;
  Index local_1bc;
  Index bitsRight_7;
  Index maxBitsLeft_11;
  Const *c_8;
  Index bitsRight_6;
  Index maxBitsLeft_10;
  Const *c_7;
  int local_198;
  Index local_194;
  Const *pCStack_190;
  int32_t bitsRight_5;
  Const *c_6;
  int local_180;
  int32_t maxBitsLeft_9;
  Index local_178;
  Index local_174;
  int32_t bitsRight_4;
  int32_t maxBitsLeft_8;
  Const *c_5;
  uint local_160;
  Index local_15c;
  Index local_158;
  Index maxBitsLeft_7;
  Index maxBitsRight_3;
  Index local_14c;
  Index local_148;
  Index maxBitsRight_2;
  Index maxBitsLeft_6;
  Index local_13c;
  uint local_138;
  Index local_134;
  uint shifts_2;
  Index maxBits_1;
  Const *shift_1;
  uint local_120;
  Index local_11c;
  uint local_118;
  Index local_114;
  uint shifts_1;
  Index maxBits;
  Const *shift;
  Const *local_100;
  Const *shifts;
  Index local_f0;
  Index local_ec;
  uint local_e8;
  Index local_e4;
  Index bitsRight_3;
  Index maxBitsLeft_5;
  Const *c_4;
  Index bitsRight_2;
  Index maxBitsLeft_4;
  Const *c_3;
  int local_c0;
  Index local_bc;
  Const *pCStack_b8;
  int32_t bitsRight_1;
  Const *c_2;
  int local_a8;
  int32_t maxBitsLeft_3;
  Index local_a0;
  Index local_9c;
  int32_t bitsRight;
  int32_t maxBitsLeft_2;
  Const *c_1;
  Index local_88;
  Index local_84;
  Index maxBitsLeft_1;
  Index maxBitsRight_1;
  Index local_78;
  Index local_74;
  Index maxBitsRight;
  Index maxBitsLeft;
  Binary *binary;
  Literal local_40;
  Const *local_28;
  Const *c;
  OptimizeInstructions *localInfoProvider_local;
  Expression *curr_local;
  
  c = (Const *)localInfoProvider;
  localInfoProvider_local = (OptimizeInstructions *)curr;
  bVar1 = Properties::emitsBoolean(curr);
  if (bVar1) {
    return 1;
  }
  local_28 = Expression::dynCast<wasm::Const>((Expression *)localInfoProvider_local);
  if (local_28 != (Const *)0x0) {
    BVar2 = wasm::Type::getBasic
                      ((Type *)&(localInfoProvider_local->
                                super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                                ).super_Pass.runner);
    if (BVar2 == i32) {
      wasm::Literal::countLeadingZeroes(&local_40,&local_28->value);
      iVar3 = wasm::Literal::geti32(&local_40);
      curr_local._4_4_ = 0x20 - iVar3;
      wasm::Literal::~Literal(&local_40);
      return curr_local._4_4_;
    }
    if (BVar2 != i64) {
      handle_unreachable("invalid type",
                         "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/bits.h"
                         ,0xa3);
    }
    wasm::Literal::countLeadingZeroes((Literal *)&binary,&local_28->value);
    iVar6 = wasm::Literal::geti64((Literal *)&binary);
    curr_local._4_4_ = 0x40 - (int)iVar6;
    wasm::Literal::~Literal((Literal *)&binary);
    return curr_local._4_4_;
  }
  _maxBitsRight = Expression::dynCast<wasm::Binary>((Expression *)localInfoProvider_local);
  if (_maxBitsRight == (Binary *)0x0) {
    local_230 = Expression::dynCast<wasm::Unary>((Expression *)localInfoProvider_local);
    if (local_230 == (Unary *)0x0) {
      pLVar10 = Expression::dynCast<wasm::LocalSet>((Expression *)localInfoProvider_local);
      if (pLVar10 != (LocalSet *)0x0) {
        IVar5 = getMaxBits<wasm::OptimizeInstructions>(pLVar10->value,(OptimizeInstructions *)c);
        return IVar5;
      }
      get_00 = Expression::dynCast<wasm::LocalGet>((Expression *)localInfoProvider_local);
      if (get_00 != (LocalGet *)0x0) {
        if (c == (Const *)0x0) {
          __assert_fail("localInfoProvider",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/bits.h"
                        ,0x1c3,
                        "Index wasm::Bits::getMaxBits(Expression *, LocalInfoProvider *) [LocalInfoProvider = wasm::OptimizeInstructions]"
                       );
        }
        IVar5 = OptimizeInstructions::getMaxBitsForLocal((OptimizeInstructions *)c,get_00);
        return IVar5;
      }
      load_00 = Expression::dynCast<wasm::Load>((Expression *)localInfoProvider_local);
      if (((load_00 != (Load *)0x0) && (bVar1 = LoadUtils::isSignRelevant(load_00), bVar1)) &&
         ((load_00->signed_ & 1U) == 0)) {
        return (uint)load_00->bytes << 3;
      }
    }
    else {
      switch(local_230->op) {
      case ClzInt32:
      case CtzInt32:
      case PopcntInt32:
        return 6;
      case ClzInt64:
      case CtzInt64:
      case PopcntInt64:
        return 7;
      default:
        break;
      case EqZInt32:
      case EqZInt64:
        handle_unreachable("relationals handled before",
                           "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/bits.h"
                           ,0x1a2);
      case ExtendSInt32:
      case ExtendS32Int64:
        local_2b4 = getMaxBits<wasm::OptimizeInstructions>
                              (local_230->value,(OptimizeInstructions *)c);
        if (0x1f < local_2b4) {
          local_2b4 = 0x40;
        }
        return local_2b4;
      case ExtendUInt32:
      case WrapInt64:
        maxBits_5 = 0x20;
        maxBits_6 = getMaxBits<wasm::OptimizeInstructions>
                              (local_230->value,(OptimizeInstructions *)c);
        puVar9 = std::min<unsigned_int>(&maxBits_5,&maxBits_6);
        return *puVar9;
      case ExtendS8Int32:
        local_2a4 = getMaxBits<wasm::OptimizeInstructions>
                              (local_230->value,(OptimizeInstructions *)c);
        if (7 < local_2a4) {
          local_2a4 = 0x20;
        }
        return local_2a4;
      case ExtendS16Int32:
        local_2a8 = getMaxBits<wasm::OptimizeInstructions>
                              (local_230->value,(OptimizeInstructions *)c);
        if (0xf < local_2a8) {
          local_2a8 = 0x20;
        }
        return local_2a8;
      case ExtendS8Int64:
        local_2ac = getMaxBits<wasm::OptimizeInstructions>
                              (local_230->value,(OptimizeInstructions *)c);
        if (7 < local_2ac) {
          local_2ac = 0x40;
        }
        return local_2ac;
      case ExtendS16Int64:
        local_2b0 = getMaxBits<wasm::OptimizeInstructions>
                              (local_230->value,(OptimizeInstructions *)c);
        if (0xf < local_2b0) {
          local_2b0 = 0x40;
        }
        return local_2b0;
      }
    }
  }
  else {
    switch(_maxBitsRight->op) {
    case AddInt32:
      local_74 = getMaxBits<wasm::OptimizeInstructions>
                           (_maxBitsRight->left,(OptimizeInstructions *)c);
      local_78 = getMaxBits<wasm::OptimizeInstructions>
                           (_maxBitsRight->right,(OptimizeInstructions *)c);
      maxBitsRight_1 = 0x20;
      puVar9 = std::max<unsigned_int>(&local_74,&local_78);
      maxBitsLeft_1 = *puVar9 + 1;
      puVar9 = std::min<unsigned_int>(&maxBitsRight_1,&maxBitsLeft_1);
      return *puVar9;
    case SubInt32:
    case RotLInt32:
    case RotRInt32:
      return 0x20;
    case MulInt32:
      local_84 = getMaxBits<wasm::OptimizeInstructions>
                           (_maxBitsRight->right,(OptimizeInstructions *)c);
      local_88 = getMaxBits<wasm::OptimizeInstructions>
                           (_maxBitsRight->left,(OptimizeInstructions *)c);
      c_1._4_4_ = 0x20;
      c_1._0_4_ = local_88 + local_84;
      puVar9 = std::min<unsigned_int>((uint *)((long)&c_1 + 4),(uint *)&c_1);
      return *puVar9;
    case DivSInt32:
      _bitsRight = Expression::dynCast<wasm::Const>(_maxBitsRight->right);
      if (_bitsRight == (Const *)0x0) {
        return 0x20;
      }
      local_9c = getMaxBits<wasm::OptimizeInstructions>
                           (_maxBitsRight->left,(OptimizeInstructions *)c);
      if ((local_9c != 0x20) && (iVar3 = wasm::Literal::geti32(&_bitsRight->value), -1 < iVar3)) {
        local_a0 = getMaxBits<wasm::Bits::DummyLocalInfoProvider>
                             ((Expression *)_bitsRight,(DummyLocalInfoProvider *)0x0);
        maxBitsLeft_3 = 0;
        local_a8 = (local_9c - local_a0) + 1;
        piVar7 = std::max<int>(&maxBitsLeft_3,&local_a8);
        pIVar8 = (Index *)std::min<int>((int *)&local_9c,piVar7);
        return *pIVar8;
      }
      return 0x20;
    case DivUInt32:
      c_2._4_4_ = getMaxBits<wasm::OptimizeInstructions>
                            (_maxBitsRight->left,(OptimizeInstructions *)c);
      pCStack_b8 = Expression::dynCast<wasm::Const>(_maxBitsRight->right);
      if (pCStack_b8 == (Const *)0x0) {
        return c_2._4_4_;
      }
      local_bc = getMaxBits<wasm::Bits::DummyLocalInfoProvider>
                           ((Expression *)pCStack_b8,(DummyLocalInfoProvider *)0x0);
      local_c0 = 0;
      c_3._4_4_ = (c_2._4_4_ - local_bc) + 1;
      piVar7 = std::max<int>(&local_c0,(int *)((long)&c_3 + 4));
      pIVar8 = (Index *)std::min<int>((int *)((long)&c_2 + 4),piVar7);
      return *pIVar8;
    case RemSInt32:
      _bitsRight_2 = Expression::dynCast<wasm::Const>(_maxBitsRight->right);
      if (_bitsRight_2 == (Const *)0x0) {
        return 0x20;
      }
      c_4._4_4_ = getMaxBits<wasm::OptimizeInstructions>
                            (_maxBitsRight->left,(OptimizeInstructions *)c);
      if (c_4._4_4_ != 0x20) {
        iVar3 = wasm::Literal::geti32(&_bitsRight_2->value);
        c_4._0_4_ = ceilLog2(iVar3);
        puVar9 = std::min<unsigned_int>((uint *)((long)&c_4 + 4),(uint *)&c_4);
        return *puVar9;
      }
      return 0x20;
    case RemUInt32:
      _bitsRight_3 = Expression::dynCast<wasm::Const>(_maxBitsRight->right);
      if (_bitsRight_3 == (Const *)0x0) {
        return 0x20;
      }
      local_e4 = getMaxBits<wasm::OptimizeInstructions>
                           (_maxBitsRight->left,(OptimizeInstructions *)c);
      iVar3 = wasm::Literal::geti32(&_bitsRight_3->value);
      local_e8 = ceilLog2(iVar3);
      puVar9 = std::min<unsigned_int>(&local_e4,&local_e8);
      return *puVar9;
    case AndInt32:
      local_ec = getMaxBits<wasm::OptimizeInstructions>
                           (_maxBitsRight->left,(OptimizeInstructions *)c);
      local_f0 = getMaxBits<wasm::OptimizeInstructions>
                           (_maxBitsRight->right,(OptimizeInstructions *)c);
      puVar9 = std::min<unsigned_int>(&local_ec,&local_f0);
      return *puVar9;
    case OrInt32:
    case XorInt32:
      shifts._4_4_ = getMaxBits<wasm::OptimizeInstructions>
                               (_maxBitsRight->left,(OptimizeInstructions *)c);
      shifts._0_4_ = getMaxBits<wasm::OptimizeInstructions>
                               (_maxBitsRight->right,(OptimizeInstructions *)c);
      puVar9 = std::max<unsigned_int>((uint *)((long)&shifts + 4),(uint *)&shifts);
      return *puVar9;
    case ShlInt32:
      local_100 = Expression::dynCast<wasm::Const>(_maxBitsRight->right);
      if (local_100 == (Const *)0x0) {
        return 0x20;
      }
      shift._4_4_ = 0x20;
      IVar5 = getMaxBits<wasm::OptimizeInstructions>(_maxBitsRight->left,(OptimizeInstructions *)c);
      IVar4 = getEffectiveShifts((Expression *)local_100);
      shift._0_4_ = IVar5 + IVar4;
      puVar9 = std::min<unsigned_int>((uint *)((long)&shift + 4),(uint *)&shift);
      return *puVar9;
    case ShrSInt32:
      _shifts_2 = Expression::dynCast<wasm::Const>(_maxBitsRight->right);
      if (_shifts_2 == (Const *)0x0) {
        return 0x20;
      }
      local_134 = getMaxBits<wasm::OptimizeInstructions>
                            (_maxBitsRight->left,(OptimizeInstructions *)c);
      if (local_134 != 0x20) {
        local_13c = getEffectiveShifts((Expression *)_shifts_2);
        puVar9 = std::min<unsigned_int>(&local_13c,&local_134);
        local_138 = *puVar9;
        maxBitsLeft_6 = 0;
        maxBitsRight_2 = local_134 - local_138;
        puVar9 = std::max<unsigned_int>(&maxBitsLeft_6,&maxBitsRight_2);
        return *puVar9;
      }
      return 0x20;
    case ShrUInt32:
      _shifts_1 = Expression::dynCast<wasm::Const>(_maxBitsRight->right);
      if (_shifts_1 == (Const *)0x0) {
        return 0x20;
      }
      local_114 = getMaxBits<wasm::OptimizeInstructions>
                            (_maxBitsRight->left,(OptimizeInstructions *)c);
      local_11c = getEffectiveShifts((Expression *)_shifts_1);
      puVar9 = std::min<unsigned_int>(&local_11c,&local_114);
      local_118 = *puVar9;
      local_120 = 0;
      shift_1._4_4_ = local_114 - local_118;
      puVar9 = std::max<unsigned_int>(&local_120,(uint *)((long)&shift_1 + 4));
      return *puVar9;
    case EqInt32:
    case NeInt32:
    case LtSInt32:
    case LtUInt32:
    case LeSInt32:
    case LeUInt32:
    case GtSInt32:
    case GtUInt32:
    case GeSInt32:
    case GeUInt32:
    case EqInt64:
    case NeInt64:
    case LtSInt64:
    case LtUInt64:
    case LeSInt64:
    case LeUInt64:
    case GtSInt64:
    case GtUInt64:
    case GeSInt64:
    case GeUInt64:
    case EqFloat32:
    case NeFloat32:
    case LtFloat32:
    case LeFloat32:
    case GtFloat32:
    case GeFloat32:
    case EqFloat64:
    case NeFloat64:
    case LtFloat64:
    case LeFloat64:
    case GtFloat64:
    case GeFloat64:
      handle_unreachable("relationals handled before",
                         "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/bits.h"
                         ,0x192);
    case AddInt64:
      local_148 = getMaxBits<wasm::OptimizeInstructions>
                            (_maxBitsRight->left,(OptimizeInstructions *)c);
      local_14c = getMaxBits<wasm::OptimizeInstructions>
                            (_maxBitsRight->right,(OptimizeInstructions *)c);
      maxBitsRight_3 = 0x40;
      puVar9 = std::max<unsigned_int>(&local_148,&local_14c);
      maxBitsLeft_7 = *puVar9 + 1;
      puVar9 = std::min<unsigned_int>(&maxBitsRight_3,&maxBitsLeft_7);
      return *puVar9;
    case SubInt64:
    case RotLInt64:
    case RotRInt64:
      return 0x40;
    case MulInt64:
      local_158 = getMaxBits<wasm::OptimizeInstructions>
                            (_maxBitsRight->right,(OptimizeInstructions *)c);
      local_15c = getMaxBits<wasm::OptimizeInstructions>
                            (_maxBitsRight->left,(OptimizeInstructions *)c);
      local_160 = 0x40;
      c_5._4_4_ = local_15c + local_158;
      puVar9 = std::min<unsigned_int>(&local_160,(uint *)((long)&c_5 + 4));
      return *puVar9;
    case DivSInt64:
      _bitsRight_4 = Expression::dynCast<wasm::Const>(_maxBitsRight->right);
      if (_bitsRight_4 == (Const *)0x0) {
        return 0x40;
      }
      local_174 = getMaxBits<wasm::OptimizeInstructions>
                            (_maxBitsRight->left,(OptimizeInstructions *)c);
      if ((local_174 != 0x40) && (iVar6 = wasm::Literal::geti64(&_bitsRight_4->value), -1 < iVar6))
      {
        local_178 = getMaxBits<wasm::Bits::DummyLocalInfoProvider>
                              ((Expression *)_bitsRight_4,(DummyLocalInfoProvider *)0x0);
        maxBitsLeft_9 = 0;
        local_180 = (local_174 - local_178) + 1;
        piVar7 = std::max<int>(&maxBitsLeft_9,&local_180);
        pIVar8 = (Index *)std::min<int>((int *)&local_174,piVar7);
        return *pIVar8;
      }
      return 0x40;
    case DivUInt64:
      c_6._4_4_ = getMaxBits<wasm::OptimizeInstructions>
                            (_maxBitsRight->left,(OptimizeInstructions *)c);
      pCStack_190 = Expression::dynCast<wasm::Const>(_maxBitsRight->right);
      if (pCStack_190 == (Const *)0x0) {
        return c_6._4_4_;
      }
      local_194 = getMaxBits<wasm::Bits::DummyLocalInfoProvider>
                            ((Expression *)pCStack_190,(DummyLocalInfoProvider *)0x0);
      local_198 = 0;
      c_7._4_4_ = (c_6._4_4_ - local_194) + 1;
      piVar7 = std::max<int>(&local_198,(int *)((long)&c_7 + 4));
      pIVar8 = (Index *)std::min<int>((int *)((long)&c_6 + 4),piVar7);
      return *pIVar8;
    case RemSInt64:
      _bitsRight_6 = Expression::dynCast<wasm::Const>(_maxBitsRight->right);
      if (_bitsRight_6 == (Const *)0x0) {
        return 0x40;
      }
      c_8._4_4_ = getMaxBits<wasm::OptimizeInstructions>
                            (_maxBitsRight->left,(OptimizeInstructions *)c);
      if (c_8._4_4_ != 0x40) {
        iVar6 = wasm::Literal::geti64(&_bitsRight_6->value);
        c_8._0_4_ = ceilLog2(iVar6);
        puVar9 = std::min<unsigned_int>((uint *)((long)&c_8 + 4),(uint *)&c_8);
        return *puVar9;
      }
      return 0x40;
    case RemUInt64:
      _bitsRight_7 = Expression::dynCast<wasm::Const>(_maxBitsRight->right);
      if (_bitsRight_7 == (Const *)0x0) {
        return 0x40;
      }
      local_1bc = getMaxBits<wasm::OptimizeInstructions>
                            (_maxBitsRight->left,(OptimizeInstructions *)c);
      iVar6 = wasm::Literal::geti64(&_bitsRight_7->value);
      local_1c0 = ceilLog2(iVar6);
      puVar9 = std::min<unsigned_int>(&local_1bc,&local_1c0);
      return *puVar9;
    case AndInt64:
      local_1c4 = getMaxBits<wasm::OptimizeInstructions>
                            (_maxBitsRight->left,(OptimizeInstructions *)c);
      local_1c8 = getMaxBits<wasm::OptimizeInstructions>
                            (_maxBitsRight->right,(OptimizeInstructions *)c);
      puVar9 = std::min<unsigned_int>(&local_1c4,&local_1c8);
      return *puVar9;
    case OrInt64:
    case XorInt64:
      shifts_3._4_4_ =
           getMaxBits<wasm::OptimizeInstructions>(_maxBitsRight->left,(OptimizeInstructions *)c);
      shifts_3._0_4_ =
           getMaxBits<wasm::OptimizeInstructions>(_maxBitsRight->right,(OptimizeInstructions *)c);
      puVar9 = std::max<unsigned_int>((uint *)((long)&shifts_3 + 4),(uint *)&shifts_3);
      return *puVar9;
    case ShlInt64:
      pCStack_1d8 = Expression::dynCast<wasm::Const>(_maxBitsRight->right);
      if (pCStack_1d8 == (Const *)0x0) {
        return 0x40;
      }
      local_1dc = getMaxBits<wasm::OptimizeInstructions>
                            (_maxBitsRight->left,(OptimizeInstructions *)c);
      local_1e0 = 0x40;
      IVar5 = getEffectiveShifts((Expression *)pCStack_1d8);
      shift_2._4_4_ = IVar5 + local_1dc;
      puVar9 = std::min<unsigned_int>(&local_1e0,(uint *)((long)&shift_2 + 4));
      return *puVar9;
    case ShrSInt64:
      _shifts_5 = Expression::dynCast<wasm::Const>(_maxBitsRight->right);
      if (_shifts_5 == (Const *)0x0) {
        return 0x40;
      }
      local_214 = getMaxBits<wasm::OptimizeInstructions>
                            (_maxBitsRight->left,(OptimizeInstructions *)c);
      if (local_214 != 0x40) {
        local_21c = getEffectiveShifts((Expression *)_shifts_5);
        puVar9 = std::min<unsigned_int>(&local_21c,&local_214);
        local_218 = *puVar9;
        local_220 = 0;
        unary._4_4_ = local_214 - local_218;
        puVar9 = std::max<unsigned_int>(&local_220,(uint *)((long)&unary + 4));
        return *puVar9;
      }
      return 0x40;
    case ShrUInt64:
      _shifts_4 = Expression::dynCast<wasm::Const>(_maxBitsRight->right);
      if (_shifts_4 == (Const *)0x0) {
        return 0x40;
      }
      local_1f4 = getMaxBits<wasm::OptimizeInstructions>
                            (_maxBitsRight->left,(OptimizeInstructions *)c);
      local_1fc = getEffectiveShifts((Expression *)_shifts_4);
      puVar9 = std::min<unsigned_int>(&local_1fc,&local_1f4);
      local_1f8 = *puVar9;
      local_200 = 0;
      shift_3._4_4_ = local_1f4 - local_1f8;
      puVar9 = std::max<unsigned_int>(&local_200,(uint *)((long)&shift_3 + 4));
      return *puVar9;
    default:
    }
  }
  BVar2 = wasm::Type::getBasic
                    ((Type *)&(localInfoProvider_local->
                              super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                              ).super_Pass.runner);
  if (BVar2 == unreachable) {
    curr_local._4_4_ = 0x40;
  }
  else if (BVar2 == i32) {
    curr_local._4_4_ = 0x20;
  }
  else {
    if (BVar2 != i64) {
      handle_unreachable("invalid type",
                         "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/bits.h"
                         ,0x1d4);
    }
    curr_local._4_4_ = 0x40;
  }
  return curr_local._4_4_;
}

Assistant:

Index getMaxBits(Expression* curr,
                 LocalInfoProvider* localInfoProvider = nullptr) {
  if (Properties::emitsBoolean(curr)) {
    return 1;
  }
  if (auto* c = curr->dynCast<Const>()) {
    switch (curr->type.getBasic()) {
      case Type::i32:
        return 32 - c->value.countLeadingZeroes().geti32();
      case Type::i64:
        return 64 - c->value.countLeadingZeroes().geti64();
      default:
        WASM_UNREACHABLE("invalid type");
    }
  } else if (auto* binary = curr->dynCast<Binary>()) {
    switch (binary->op) {
      // 32-bit
      case RotLInt32:
      case RotRInt32:
      case SubInt32:
        return 32;
      case AddInt32: {
        auto maxBitsLeft = getMaxBits(binary->left, localInfoProvider);
        auto maxBitsRight = getMaxBits(binary->right, localInfoProvider);
        return std::min(Index(32), std::max(maxBitsLeft, maxBitsRight) + 1);
      }
      case MulInt32: {
        auto maxBitsRight = getMaxBits(binary->right, localInfoProvider);
        auto maxBitsLeft = getMaxBits(binary->left, localInfoProvider);
        return std::min(Index(32), maxBitsLeft + maxBitsRight);
      }
      case DivSInt32: {
        if (auto* c = binary->right->dynCast<Const>()) {
          int32_t maxBitsLeft = getMaxBits(binary->left, localInfoProvider);
          // If either side might be negative, then the result will be negative
          if (maxBitsLeft == 32 || c->value.geti32() < 0) {
            return 32;
          }
          int32_t bitsRight = getMaxBits(c);
          // Apply std::min: Result bits cannot exceed dividend bits
          return std::min(maxBitsLeft,
                          std::max(0, maxBitsLeft - bitsRight + 1));
        }
        return 32;
      }
      case DivUInt32: {
        int32_t maxBitsLeft = getMaxBits(binary->left, localInfoProvider);
        if (auto* c = binary->right->dynCast<Const>()) {
          int32_t bitsRight = getMaxBits(c);
          // Apply std::min: Result bits cannot exceed dividend bits
          return std::min(maxBitsLeft,
                          std::max(0, maxBitsLeft - bitsRight + 1));
        }
        return maxBitsLeft;
      }
      case RemSInt32: {
        if (auto* c = binary->right->dynCast<Const>()) {
          auto maxBitsLeft = getMaxBits(binary->left, localInfoProvider);
          // if left may be negative, the result may be negative
          if (maxBitsLeft == 32) {
            return 32;
          }
          auto bitsRight = Index(ceilLog2(c->value.geti32()));
          return std::min(maxBitsLeft, bitsRight);
        }
        return 32;
      }
      case RemUInt32: {
        if (auto* c = binary->right->dynCast<Const>()) {
          auto maxBitsLeft = getMaxBits(binary->left, localInfoProvider);
          auto bitsRight = Index(ceilLog2(c->value.geti32()));
          return std::min(maxBitsLeft, bitsRight);
        }
        return 32;
      }
      case AndInt32: {
        return std::min(getMaxBits(binary->left, localInfoProvider),
                        getMaxBits(binary->right, localInfoProvider));
      }
      case OrInt32:
      case XorInt32: {
        return std::max(getMaxBits(binary->left, localInfoProvider),
                        getMaxBits(binary->right, localInfoProvider));
      }
      case ShlInt32: {
        if (auto* shifts = binary->right->dynCast<Const>()) {
          return std::min(Index(32),
                          getMaxBits(binary->left, localInfoProvider) +
                            Bits::getEffectiveShifts(shifts));
        }
        return 32;
      }
      case ShrUInt32: {
        if (auto* shift = binary->right->dynCast<Const>()) {
          auto maxBits = getMaxBits(binary->left, localInfoProvider);
          auto shifts =
            std::min(Index(Bits::getEffectiveShifts(shift)),
                     maxBits); // can ignore more shifts than zero us out
          return std::max(Index(0), maxBits - shifts);
        }
        return 32;
      }
      case ShrSInt32: {
        if (auto* shift = binary->right->dynCast<Const>()) {
          auto maxBits = getMaxBits(binary->left, localInfoProvider);
          // if left may be negative, the result may be negative
          if (maxBits == 32) {
            return 32;
          }
          auto shifts =
            std::min(Index(Bits::getEffectiveShifts(shift)),
                     maxBits); // can ignore more shifts than zero us out
          return std::max(Index(0), maxBits - shifts);
        }
        return 32;
      }
      case RotLInt64:
      case RotRInt64:
      case SubInt64:
        return 64;
      case AddInt64: {
        auto maxBitsLeft = getMaxBits(binary->left, localInfoProvider);
        auto maxBitsRight = getMaxBits(binary->right, localInfoProvider);
        return std::min(Index(64), std::max(maxBitsLeft, maxBitsRight) + 1);
      }
      case MulInt64: {
        auto maxBitsRight = getMaxBits(binary->right, localInfoProvider);
        auto maxBitsLeft = getMaxBits(binary->left, localInfoProvider);
        return std::min(Index(64), maxBitsLeft + maxBitsRight);
      }
      case DivSInt64: {
        if (auto* c = binary->right->dynCast<Const>()) {
          int32_t maxBitsLeft = getMaxBits(binary->left, localInfoProvider);
          // if left or right const value is negative
          if (maxBitsLeft == 64 || c->value.geti64() < 0) {
            return 64;
          }
          int32_t bitsRight = getMaxBits(c);
          // Apply std::min: Result bits cannot exceed dividend bits
          return std::min(maxBitsLeft,
                          std::max(0, maxBitsLeft - bitsRight + 1));
        }
        return 64;
      }
      case DivUInt64: {
        int32_t maxBitsLeft = getMaxBits(binary->left, localInfoProvider);
        if (auto* c = binary->right->dynCast<Const>()) {
          int32_t bitsRight = getMaxBits(c);
          // Apply std::min: Result bits cannot exceed dividend bits
          return std::min(maxBitsLeft,
                          std::max(0, maxBitsLeft - bitsRight + 1));
        }
        return maxBitsLeft;
      }
      case RemSInt64: {
        if (auto* c = binary->right->dynCast<Const>()) {
          auto maxBitsLeft = getMaxBits(binary->left, localInfoProvider);
          // if left may be negative, the result may be negative
          if (maxBitsLeft == 64) {
            return 64;
          }
          auto bitsRight = Index(ceilLog2(c->value.geti64()));
          return std::min(maxBitsLeft, bitsRight);
        }
        return 64;
      }
      case RemUInt64: {
        if (auto* c = binary->right->dynCast<Const>()) {
          auto maxBitsLeft = getMaxBits(binary->left, localInfoProvider);
          auto bitsRight = Index(ceilLog2(c->value.geti64()));
          return std::min(maxBitsLeft, bitsRight);
        }
        return 64;
      }
      case AndInt64: {
        return std::min(getMaxBits(binary->left, localInfoProvider),
                        getMaxBits(binary->right, localInfoProvider));
      }
      case OrInt64:
      case XorInt64: {
        return std::max(getMaxBits(binary->left, localInfoProvider),
                        getMaxBits(binary->right, localInfoProvider));
      }
      case ShlInt64: {
        if (auto* shifts = binary->right->dynCast<Const>()) {
          auto maxBits = getMaxBits(binary->left, localInfoProvider);
          return std::min(Index(64),
                          Bits::getEffectiveShifts(shifts) + maxBits);
        }
        return 64;
      }
      case ShrUInt64: {
        if (auto* shift = binary->right->dynCast<Const>()) {
          auto maxBits = getMaxBits(binary->left, localInfoProvider);
          auto shifts =
            std::min(Index(Bits::getEffectiveShifts(shift)),
                     maxBits); // can ignore more shifts than zero us out
          return std::max(Index(0), maxBits - shifts);
        }
        return 64;
      }
      case ShrSInt64: {
        if (auto* shift = binary->right->dynCast<Const>()) {
          auto maxBits = getMaxBits(binary->left, localInfoProvider);
          // if left may be negative, the result may be negative
          if (maxBits == 64) {
            return 64;
          }
          auto shifts =
            std::min(Index(Bits::getEffectiveShifts(shift)),
                     maxBits); // can ignore more shifts than zero us out
          return std::max(Index(0), maxBits - shifts);
        }
        return 64;
      }
      // comparisons
      case EqInt32:
      case NeInt32:
      case LtSInt32:
      case LtUInt32:
      case LeSInt32:
      case LeUInt32:
      case GtSInt32:
      case GtUInt32:
      case GeSInt32:
      case GeUInt32:

      case EqInt64:
      case NeInt64:
      case LtSInt64:
      case LtUInt64:
      case LeSInt64:
      case LeUInt64:
      case GtSInt64:
      case GtUInt64:
      case GeSInt64:
      case GeUInt64:

      case EqFloat32:
      case NeFloat32:
      case LtFloat32:
      case LeFloat32:
      case GtFloat32:
      case GeFloat32:

      case EqFloat64:
      case NeFloat64:
      case LtFloat64:
      case LeFloat64:
      case GtFloat64:
      case GeFloat64:
        WASM_UNREACHABLE("relationals handled before");
      default: {
      }
    }
  } else if (auto* unary = curr->dynCast<Unary>()) {
    switch (unary->op) {
      case ClzInt32:
      case CtzInt32:
      case PopcntInt32:
        return 6;
      case ClzInt64:
      case CtzInt64:
      case PopcntInt64:
        return 7;
      case EqZInt32:
      case EqZInt64:
        WASM_UNREACHABLE("relationals handled before");
      case WrapInt64:
      case ExtendUInt32:
        return std::min(Index(32), getMaxBits(unary->value, localInfoProvider));
      case ExtendS8Int32: {
        auto maxBits = getMaxBits(unary->value, localInfoProvider);
        return maxBits >= 8 ? Index(32) : maxBits;
      }
      case ExtendS16Int32: {
        auto maxBits = getMaxBits(unary->value, localInfoProvider);
        return maxBits >= 16 ? Index(32) : maxBits;
      }
      case ExtendS8Int64: {
        auto maxBits = getMaxBits(unary->value, localInfoProvider);
        return maxBits >= 8 ? Index(64) : maxBits;
      }
      case ExtendS16Int64: {
        auto maxBits = getMaxBits(unary->value, localInfoProvider);
        return maxBits >= 16 ? Index(64) : maxBits;
      }
      case ExtendS32Int64:
      case ExtendSInt32: {
        auto maxBits = getMaxBits(unary->value, localInfoProvider);
        return maxBits >= 32 ? Index(64) : maxBits;
      }
      default: {
      }
    }
  } else if (auto* set = curr->dynCast<LocalSet>()) {
    // a tee passes through the value
    return getMaxBits(set->value, localInfoProvider);
  } else if (auto* get = curr->dynCast<LocalGet>()) {
    // TODO: Should this be optional?
    assert(localInfoProvider);
    return localInfoProvider->getMaxBitsForLocal(get);
  } else if (auto* load = curr->dynCast<Load>()) {
    // if signed, then the sign-extension might fill all the bits
    // if unsigned, then we have a limit
    if (LoadUtils::isSignRelevant(load) && !load->signed_) {
      return 8 * load->bytes;
    }
  }
  switch (curr->type.getBasic()) {
    case Type::i32:
      return 32;
    case Type::i64:
      return 64;
    case Type::unreachable:
      return 64; // not interesting, but don't crash
    default:
      WASM_UNREACHABLE("invalid type");
  }
}